

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateElementDampingEnergy
          (ChElementBeamTaperedTimoshenko *this,ChVector<double> *DampingEnergyV_trans,
          ChVector<double> *DampingEnergyV_rot)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  long lVar3;
  int i;
  long index;
  bool bVar4;
  ChVectorDynamic<> displ_dt;
  ChVectorDynamic<> displ;
  ChVectorN<double,_6> damping_energy_v;
  ChVectorN<double,_12> damping_energy;
  Matrix<double,__1,_1,_0,__1,_1> local_1d0;
  ChVector<double> *local_1c0;
  double local_1b8;
  Scalar local_1b0;
  Matrix<double,__1,_1,_0,__1,_1> local_1a8;
  Matrix<double,__1,_1,_0,__1,_1> *local_198;
  Scalar local_190;
  Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_188;
  Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>
  local_140;
  int local_100 [28];
  DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_90;
  
  local_1c0 = DampingEnergyV_rot;
  local_100[0] = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                   _vptr_ChElementBase[3])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1a8,local_100);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_1a8);
  local_100[0] = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                   _vptr_ChElementBase[3])(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1d0,local_100);
  GetField_dt(this,&local_1d0);
  local_190 = 0.5;
  local_198 = &local_1a8;
  Eigen::operator*(&local_90,&local_190,
                   (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_198);
  Eigen::
  Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>
  ::Product(&local_140,&local_90,&this->Rm);
  Eigen::
  Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
  ::Product(&local_188,&local_140,&local_1d0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_100,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_188);
  lVar3 = 6;
  index = 0;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)local_100,
                        index);
    local_1b0 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)local_100,
                        index + 6);
    local_1b8 = *pSVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&local_140,index
                       );
    index = index + 1;
    *pSVar2 = local_1b8 + local_1b0;
  }
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_188,
             (Matrix<double,_6,_1,_0,_6,_1> *)&local_140,0,3);
  ChVector<double>::operator=
            (DampingEnergyV_trans,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_188);
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_188,
             (Matrix<double,_6,_1,_0,_6,_1> *)&local_140,3,3);
  ChVector<double>::operator=
            (local_1c0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_188);
  Eigen::internal::handmade_aligned_free
            (local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateElementDampingEnergy(ChVector<>& DampingEnergyV_trans,
                                                                  ChVector<>& DampingEnergyV_rot) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    ChVectorDynamic<> displ_dt(this->GetNdofs());
    this->GetField_dt(displ_dt);

    ChVectorN<double, 12> damping_energy = 1.0 / 2.0 * displ.asDiagonal() * this->Rm * displ_dt;
    ChVectorN<double, 6> damping_energy_v;
    // double damping_energy_sum = 0;
    for (int i = 0; i < 6; i++) {
        damping_energy_v(i) = damping_energy(i) + damping_energy(i + 6);
        // damping_energy_sum += damping_energy_v(i);
    }

    DampingEnergyV_trans = damping_energy_v.segment(0, 3);
    DampingEnergyV_rot = damping_energy_v.segment(3, 3);
}